

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O0

RC __thiscall RM_FileHandle::UpdateRec(RM_FileHandle *this,RM_Record *rec)

{
  bool bVar1;
  RC local_7c;
  char *pcStack_78;
  RC rc2;
  char *recData;
  bool recordExists;
  RM_PageHeader *pageheader;
  char *bitmap;
  PF_PageHandle ph;
  SlotNum slot;
  PageNum page;
  RID local_2c;
  RID rid;
  RC rc;
  RM_Record *rec_local;
  RM_FileHandle *this_local;
  
  unique0x10000242 = rec;
  bVar1 = isValidFH(this);
  if (bVar1) {
    rid.page = 0;
    RID::RID(&local_2c);
    rid.page = RM_Record::GetRid(stack0xffffffffffffffe0,&local_2c);
    this_local._4_4_ = rid.page;
    if ((rid.page == 0) &&
       (rid.page = GetPageNumAndSlot(this,&local_2c,(PageNum *)((long)&ph.pPageData + 4),
                                     (SlotNum *)&ph.pPageData), this_local._4_4_ = rid.page,
       rid.page == 0)) {
      PF_PageHandle::PF_PageHandle((PF_PageHandle *)&bitmap);
      rid.page = PF_FileHandle::GetThisPage(&this->pfh,ph.pPageData._4_4_,(PF_PageHandle *)&bitmap);
      this_local._4_4_ = rid.page;
      if (rid.page == 0) {
        rid.page = GetPageDataAndBitmap
                             (this,(PF_PageHandle *)&bitmap,(char **)&pageheader,
                              (RM_PageHeader **)&stack0xffffffffffffff98);
        if ((rid.page == 0) &&
           (rid.page = CheckBitSet(this,(char *)pageheader,(this->header).numRecordsPerPage,
                                   (int)ph.pPageData,(bool *)((long)&recData + 7)), rid.page == 0))
        {
          if ((recData._7_1_ & 1) == 0) {
            rid.page = 0x67;
          }
          else {
            rid.page = RM_Record::GetData(stack0xffffffffffffffe0,&stack0xffffffffffffff88);
            if (rid.page == 0) {
              memcpy((void *)((long)&pageheader->nextFreePage +
                             (long)((int)ph.pPageData * (this->header).recordSize) +
                             (long)(this->header).bitmapSize),pcStack_78,
                     (long)(this->header).recordSize);
            }
          }
        }
        local_7c = PF_FileHandle::MarkDirty(&this->pfh,ph.pPageData._4_4_);
        if ((local_7c == 0) &&
           (local_7c = PF_FileHandle::UnpinPage(&this->pfh,ph.pPageData._4_4_), local_7c == 0)) {
          this_local._4_4_ = rid.page;
        }
        else {
          this_local._4_4_ = local_7c;
        }
      }
      PF_PageHandle::~PF_PageHandle((PF_PageHandle *)&bitmap);
    }
    RID::~RID(&local_2c);
  }
  else {
    this_local._4_4_ = 0x6a;
  }
  return this_local._4_4_;
}

Assistant:

RC RM_FileHandle::UpdateRec (const RM_Record &rec) {
  // only proceed if this filehandle is associated with an open file
  if (!isValidFH())
    return (RM_INVALIDFILE);
  RC rc = 0;

  // retrieves the page and slot number of the record
  RID rid;
  if((rc = rec.GetRid(rid)))
    return (rc);
  PageNum page;
  SlotNum slot;
  if((rc = GetPageNumAndSlot(rid, page, slot)))
    return (rc);

  // gets the page, bitmap and pageheader for this page that holds the record
  PF_PageHandle ph;
  if((rc = pfh.GetThisPage(page, ph)))
    return (rc);
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    goto cleanup_and_exit;

  // Check if there really exists a record here according to the header
  bool recordExists;
  if ((rc = CheckBitSet(bitmap, header.numRecordsPerPage, slot, recordExists)))
    goto cleanup_and_exit;
  if(!recordExists){
    rc = RM_INVALIDRECORD;
    goto cleanup_and_exit;
  }
  
  // updates its contents
  char * recData;
  if((rc = rec.GetData(recData)))
    goto cleanup_and_exit;
  memcpy(bitmap + (header.bitmapSize) + slot*(header.recordSize),
    recData, header.recordSize);

  // always unpin the page before returning
  cleanup_and_exit:
  RC rc2;
  if((rc2 = pfh.MarkDirty(page)) || (rc2 = pfh.UnpinPage(page)))
    return (rc2);
  return (rc); 
}